

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask exprListTableUsage(WhereMaskSet *pMaskSet,ExprList *pList)

{
  Bitmask BVar1;
  Bitmask BVar2;
  ulong uVar3;
  long lVar4;
  
  BVar2 = 0;
  if (pList != (ExprList *)0x0) {
    uVar3 = (ulong)(uint)pList->nExpr;
    if (pList->nExpr < 1) {
      uVar3 = BVar2;
    }
    for (lVar4 = 0; uVar3 * 0x20 != lVar4; lVar4 = lVar4 + 0x20) {
      BVar1 = exprTableUsage(pMaskSet,*(Expr **)((long)&pList->a->pExpr + lVar4));
      BVar2 = BVar2 | BVar1;
    }
  }
  return BVar2;
}

Assistant:

static Bitmask exprListTableUsage(WhereMaskSet *pMaskSet, ExprList *pList){
  int i;
  Bitmask mask = 0;
  if( pList ){
    for(i=0; i<pList->nExpr; i++){
      mask |= exprTableUsage(pMaskSet, pList->a[i].pExpr);
    }
  }
  return mask;
}